

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

void zone_clamped_quirks(raplcap_msr_ctx *ctx,raplcap_zone zone,uint8_t *bit1,uint8_t *bit2)

{
  uint8_t *bit2_local;
  uint8_t *bit1_local;
  raplcap_zone zone_local;
  raplcap_msr_ctx *ctx_local;
  
  if (bit1 == (uint8_t *)0x0) {
    __assert_fail("bit1 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x22d,
                  "void zone_clamped_quirks(const raplcap_msr_ctx *, raplcap_zone, uint8_t *, uint8_t *)"
                 );
  }
  if (bit2 != (uint8_t *)0x0) {
    if ((zone == RAPLCAP_ZONE_PSYS) && ((ctx->cpu_model == 0x8f || (ctx->cpu_model == 0xcf)))) {
      *bit1 = '\x12';
      *bit2 = '2';
    }
    return;
  }
  __assert_fail("bit2 != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x22e,
                "void zone_clamped_quirks(const raplcap_msr_ctx *, raplcap_zone, uint8_t *, uint8_t *)"
               );
}

Assistant:

static void zone_clamped_quirks(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint8_t* bit1, uint8_t* bit2) {
  assert(bit1 != NULL);
  assert(bit2 != NULL);
  if (zone == RAPLCAP_ZONE_PSYS &&
      (ctx->cpu_model == CPUID_MODEL_SAPPHIRERAPIDS_X || ctx->cpu_model == CPUID_MODEL_EMERALDRAPIDS_X)) {
    *bit1 = 18;
    *bit2 = 50;
  }
}